

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzer.cpp
# Opt level: O3

U8 __thiscall
LINAnalyzer::GetBreakField
          (LINAnalyzer *this,S64 *startingSample,S64 *endingSample,bool *framingError)

{
  AnalyzerChannelData *pAVar1;
  LINAnalyzerResults *pLVar2;
  int iVar3;
  uint uVar4;
  MarkerType MVar5;
  long lVar6;
  long lVar7;
  S64 SVar8;
  Channel *pCVar9;
  U32 i;
  U32 num_break_bits;
  double dVar10;
  undefined1 auVar11 [16];
  
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    iVar3 = AnalyzerChannelData::GetBitState();
    if (iVar3 == 1) {
      AnalyzerChannelData::AdvanceToNextEdge();
    }
    lVar6 = AnalyzerChannelData::GetSampleOfNextEdge();
    lVar7 = AnalyzerChannelData::GetSampleNumber();
    lVar6 = lVar6 - lVar7;
    auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = 0x45300000;
    uVar4 = Analyzer::GetSampleRate();
    dVar10 = round(((auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                   ((double)uVar4 / (double)((this->mSettings)._M_ptr)->mBitRate));
  } while ((uint)(long)dVar10 < 0xd);
  SVar8 = AnalyzerChannelData::GetSampleNumber();
  *startingSample = SVar8;
  uVar4 = 0;
  do {
    if (uVar4 == 0) {
      AdvanceHalfBit(this);
    }
    else {
      pAVar1 = this->mSerial;
      Analyzer::GetSampleRate();
      AnalyzerChannelData::Advance((uint)pAVar1);
    }
    pLVar2 = (this->mResults)._M_ptr;
    MVar5 = AnalyzerChannelData::GetSampleNumber();
    iVar3 = AnalyzerChannelData::GetBitState();
    AnalyzerResults::AddMarker((ulonglong)pLVar2,MVar5,(Channel *)(ulong)(iVar3 == 1 ^ 0xb));
    uVar4 = uVar4 + 1;
  } while ((uint)(long)dVar10 != uVar4);
  pAVar1 = this->mSerial;
  Analyzer::GetSampleRate();
  AnalyzerChannelData::Advance((uint)pAVar1);
  iVar3 = AnalyzerChannelData::GetBitState();
  pLVar2 = (this->mResults)._M_ptr;
  MVar5 = AnalyzerChannelData::GetSampleNumber();
  pCVar9 = (Channel *)0x9;
  if (iVar3 != 1) {
    pCVar9 = (Channel *)0x3;
  }
  AnalyzerResults::AddMarker((ulonglong)pLVar2,MVar5,pCVar9);
  *framingError = iVar3 != 1;
  SVar8 = AnalyzerChannelData::GetSampleNumber();
  *endingSample = SVar8;
  return '\0';
}

Assistant:

U8 LINAnalyzer::GetBreakField( S64& startingSample, S64& endingSample, bool& framingError )
{
    // locate the start bit (falling edge expected)...
    U32 min_break_field_low_bits =
        13; // as per the spec of LIN. at least 13 bits at master speed, but receiver only needs it to be 11 or more.
    U32 num_break_bits = 0;
    bool valid_fame = false;
    for( ;; )
    {
        mSerial->AdvanceToNextEdge();
        if( mSerial->GetBitState() == BIT_HIGH )
        {
            mSerial->AdvanceToNextEdge();
        }
        num_break_bits = round( double( mSerial->GetSampleOfNextEdge() - mSerial->GetSampleNumber() ) / SamplesPerBit() );
        if( num_break_bits >= min_break_field_low_bits )
        {
            startingSample = mSerial->GetSampleNumber();
            valid_fame = true;
            break;
        }
    }

    // AdvanceHalfBit( );
    // mResults->AddMarker( mSerial->GetSampleNumber( ), AnalyzerResults::Start, mSettings->mInputChannel );

    for( U32 i = 0; i < num_break_bits; i++ )
    {
        if( i == 0 )
            AdvanceHalfBit();
        else
            Advance( 1 );
        // let's put a dot exactly where we sample this bit:
        mResults->AddMarker( mSerial->GetSampleNumber(), mSerial->GetBitState() == BIT_HIGH ? AnalyzerResults::One : AnalyzerResults::Zero,
                             mSettings->mInputChannel );
    }

    // Validate the stop bit...
    Advance( 1 );
    if( mSerial->GetBitState() == BIT_HIGH )
    {
        mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Stop, mSettings->mInputChannel );
        framingError = false;
    }
    else
    {
        mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::ErrorSquare, mSettings->mInputChannel );
        framingError = true;
    }

    endingSample = mSerial->GetSampleNumber();

    return ( valid_fame ) ? 0 : 1;
}